

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  ostream *poVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string tmp;
  stringstream out;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  long *local_278;
  size_type local_270;
  long local_268 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long *local_238;
  size_type local_230;
  long local_228 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  long *local_1f8;
  size_type local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  size_type local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  CLI::App::get_display_name_abi_cxx11_(&local_2b8,sub,true);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  paVar1 = &local_2b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[9])(&local_2b8,this,sub);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (((sub->name_)._M_string_length == 0) &&
     ((sub->aliases_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (sub->aliases_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    detail::format_aliases(local_1a8,&sub->aliases_,(this->super_FormatterBase).column_width_ + 2);
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[4])(&local_2b8,this,sub);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  make_groups_abi_cxx11_(&local_2b8,this,sub,Sub);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[5])(&local_2b8,this,sub,2);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  local_238 = local_228;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"\n\n","");
  local_1d8 = local_1c8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"\n","");
  sVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&local_258,(char *)local_238,0,local_230);
  if (sVar6 != 0xffffffffffffffff) {
    do {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (&local_258,sVar6,local_230,(char *)local_1d8,local_1d0);
      sVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find(&local_258,(char *)local_238,sVar6 + local_1d0,local_230);
    } while (sVar6 != 0xffffffffffffffff);
  }
  paVar2 = &local_258.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p == paVar2) {
    local_2b8.field_2._8_8_ = local_258.field_2._8_8_;
    local_2b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2b8._M_dataplus._M_p = local_258._M_dataplus._M_p;
  }
  local_2b8.field_2._M_allocated_capacity._1_7_ = local_258.field_2._M_allocated_capacity._1_7_;
  local_2b8.field_2._M_local_buf[0] = local_258.field_2._M_local_buf[0];
  local_2b8._M_string_length = local_258._M_string_length;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_258._M_dataplus._M_p = (pointer)paVar2;
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_218,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b8,0,
             local_2b8._M_string_length - 1);
  make_expanded_abi_cxx11_();
  paVar2 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_2b8._M_dataplus._M_p,
             local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
  local_278 = local_268;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"\n","");
  local_1f8 = local_1e8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\n  ","");
  sVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&local_298,(char *)local_278,0,local_270);
  if (sVar6 != 0xffffffffffffffff) {
    do {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (&local_298,sVar6,local_270,(char *)local_1f8,local_1f0);
      sVar6 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find(&local_298,(char *)local_278,sVar6 + local_1f0,local_270);
    } while (sVar6 != 0xffffffffffffffff);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p == paVar2) {
    local_218.field_2._8_8_ = local_298.field_2._8_8_;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  }
  else {
    local_218._M_dataplus._M_p = local_298._M_dataplus._M_p;
  }
  local_218.field_2._M_allocated_capacity._1_7_ = local_298.field_2._M_allocated_capacity._1_7_;
  local_218.field_2._M_local_buf[0] = local_298.field_2._M_local_buf[0];
  local_218._M_string_length = local_298._M_string_length;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  local_298._M_dataplus._M_p = (pointer)paVar2;
  pbVar7 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_218,"\n");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar8) {
    uVar4 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_expanded(const App *sub) const {
    std::stringstream out;
    out << sub->get_display_name(true) << "\n";

    out << make_description(sub);
    if(sub->get_name().empty() && !sub->get_aliases().empty()) {
        detail::format_aliases(out, sub->get_aliases(), column_width_ + 2);
    }
    out << make_positionals(sub);
    out << make_groups(sub, AppFormatMode::Sub);
    out << make_subcommands(sub, AppFormatMode::Sub);

    // Drop blank spaces
    std::string tmp = detail::find_and_replace(out.str(), "\n\n", "\n");
    tmp = tmp.substr(0, tmp.size() - 1);  // Remove the final '\n'

    // Indent all but the first line (the name)
    return detail::find_and_replace(tmp, "\n", "\n  ") + "\n";
}